

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O2

_Bool sub0_matches(sub0_ctx *ctx,uint8_t *body,size_t len)

{
  size_t __n;
  int iVar1;
  void *item;
  
  for (item = nni_list_first(&ctx->topics); item != (void *)0x0;
      item = nni_list_next(&ctx->topics,item)) {
    __n = *(size_t *)((long)item + 0x10);
    if (__n <= len) {
      if (__n == 0) break;
      iVar1 = bcmp(*(void **)((long)item + 0x18),body,__n);
      if (iVar1 == 0) break;
    }
  }
  return item != (void *)0x0;
}

Assistant:

static bool
sub0_matches(sub0_ctx *ctx, uint8_t *body, size_t len)
{
	sub0_topic *topic;

	// This is a naive and trivial matcher.  Replace with a real
	// patricia trie later.
	NNI_LIST_FOREACH (&ctx->topics, topic) {
		if (len < topic->len) {
			continue;
		}
		if ((topic->len == 0) ||
		    (memcmp(topic->buf, body, topic->len) == 0)) {
			return (true);
		}
	}
	return (false);
}